

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_formats.c
# Opt level: O2

CMFormat INT_CMregister_format(CManager cm,FMStructDescList format_list)

{
  CMFormat format;
  ulong uVar1;
  int iVar2;
  uint uVar3;
  CMFormat format_00;
  size_t sVar4;
  char *pcVar5;
  CMFormat *pp_Var6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  ulong local_38;
  
  local_38 = 0;
  if (cm == (CManager)0x0 || format_list == (FMStructDescList)0x0) {
    return (CMFormat)0x0;
  }
  format_00 = (CMFormat)INT_CMmalloc(0x48);
  format_00->cm = cm;
  sVar4 = strlen(format_list->format_name);
  pcVar5 = (char *)INT_CMmalloc(sVar4 + 1);
  format_00->format_name = pcVar5;
  strcpy(pcVar5,format_list->format_name);
  format_00->fmformat = (FMFormat)0x0;
  format_00->format_list_addr = format_list;
  format_00->handler = (CMHandlerFunc)0x0;
  format_00->client_data = (void *)0x0;
  format_00->format_list = format_list;
  format_00->registration_pending = 1;
  pcVar5 = format_00->format_name;
  uVar9 = 0;
  do {
    iVar10 = cm->reg_format_count;
    if ((long)iVar10 <= (long)uVar9) {
LAB_00121755:
      if (iVar10 == (int)uVar9) {
        local_38 = uVar9;
      }
      pp_Var6 = (CMFormat *)INT_CMrealloc(cm->reg_formats,(long)iVar10 * 8 + 8);
      cm->reg_formats = pp_Var6;
      iVar10 = cm->reg_format_count;
      for (lVar8 = (long)iVar10; (int)local_38 < lVar8; lVar8 = lVar8 + -1) {
        pp_Var6[lVar8] = pp_Var6[lVar8 + -1];
        pp_Var6 = cm->reg_formats;
      }
      pp_Var6[(int)local_38] = format_00;
      cm->reg_format_count = iVar10 + 1;
      return format_00;
    }
    format = cm->reg_formats[uVar9];
    iVar2 = strcmp(pcVar5,format->format_name);
    if (iVar2 < 0) {
LAB_00121752:
      local_38 = uVar9 & 0xffffffff;
      goto LAB_00121755;
    }
    if (iVar2 == 0) {
      if (format->registration_pending != 0) {
        CMcomplete_format_registration(format,0);
      }
      if ((format_00->registration_pending != 0) &&
         (CMcomplete_format_registration(format_00,0), format_00->registration_pending != 0)) {
        uVar9 = (ulong)(uint)cm->in_format_count;
        if (cm->in_format_count < 1) {
          uVar9 = 0;
        }
        uVar1 = 0;
        do {
          uVar7 = uVar1;
          if (uVar9 * 0x48 + 0x48 == uVar7 + 0x48) {
            puts("Gack, duplicate format, but didn\'t find it");
            return (CMFormat)0x0;
          }
          uVar1 = uVar7 + 0x48;
        } while (*(FFSTypeHandle *)((long)&cm->in_formats->format + uVar7) != format_00->ffsformat);
        free(format_00->format_name);
        free(format_00);
        return *(CMFormat *)((long)&cm->in_formats->f2_format + uVar7);
      }
      uVar3 = FMformat_cmp(format_00->fmformat,cm->reg_formats[uVar9]->fmformat);
      if ((uVar3 & 0xfffffffd) == 1) {
        iVar10 = cm->reg_format_count;
        goto LAB_00121752;
      }
      if (uVar3 == 2) {
        local_38 = uVar9;
      }
      local_38 = local_38 & 0xffffffff;
    }
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

CMFormat
INT_CMregister_format(CManager cm, FMStructDescList format_list)
{
    CMFormat format;

    if ((format_list == NULL) || (cm == NULL)) 
	return NULL;

    format = INT_CMmalloc(sizeof(struct _CMFormat));
    
    format->cm = cm;
    format->format_name = INT_CMmalloc(strlen(format_list[0].format_name) + 1);
    strcpy(format->format_name, format_list[0].format_name);
    format->fmformat = NULL;
    format->format_list_addr = format_list;
    format->handler = (CMHandlerFunc) NULL;
    format->client_data = NULL;
    format->format_list = format_list;
    format->registration_pending = 1;

    format = add_format_to_cm(cm, format);
    return format;
}